

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::
deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~deque(deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this)

{
  size_type i;
  ulong uVar1;
  undefined1 local_40 [8];
  iterator it;
  
  dequeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::dequeIterator((dequeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_40,&this->m_start);
  while ((pointer)it._vptr_dequeIterator != (this->m_finish).m_cur) {
    std::__cxx11::string::~string((string *)it._vptr_dequeIterator);
    it._vptr_dequeIterator = it._vptr_dequeIterator + 4;
    if ((pointer)it._vptr_dequeIterator == it.m_first) {
      it._vptr_dequeIterator = (_func_int **)(it.m_last)->_M_string_length;
      it.m_first = (pointer)((long)it._vptr_dequeIterator + 0x100);
      it.m_cur = (pointer)it._vptr_dequeIterator;
      it.m_last = (pointer)&(it.m_last)->_M_string_length;
    }
  }
  for (uVar1 = 0; uVar1 < this->m_map_size; uVar1 = uVar1 + 1) {
    operator_delete(this->m_map[uVar1]);
  }
  operator_delete(this->m_map);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}